

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O3

void av1_init_layer_context(AV1_COMP *cpi)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  LAYER_CONTEXT *pLVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int8_t *piVar9;
  long lVar10;
  long lVar11;
  
  iVar2 = (cpi->common).mi_params.mi_rows;
  iVar3 = (cpi->common).mi_params.mi_cols;
  (cpi->svc).base_framerate = 30.0;
  (cpi->svc).current_superframe = 0;
  (cpi->svc).force_zero_mode_spatial_ref = 1;
  (cpi->svc).has_lower_quality_layer = 0;
  (cpi->svc).num_encoded_top_layer = 0;
  (cpi->svc).use_flexible_mode = 0;
  iVar7 = (cpi->svc).number_spatial_layers;
  if (0 < iVar7) {
    iVar6 = (cpi->svc).number_temporal_layers;
    lVar10 = 0;
    do {
      if (0 < iVar6) {
        lVar11 = 0;
        do {
          pLVar4 = (cpi->svc).layer_context;
          lVar8 = iVar6 * (int)lVar10 + lVar11;
          pLVar4[lVar8].rc.ni_av_qi = (cpi->oxcf).rc_cfg.worst_allowed_q;
          pLVar4[lVar8].p_rc.total_actual_bits = 0;
          pLVar4[lVar8].rc.ni_tot_qi = 0;
          pLVar4[lVar8].p_rc.tot_q = 0.0;
          pLVar4[lVar8].p_rc.avg_q = 0.0;
          pLVar4[lVar8].p_rc.ni_frames = 0;
          pLVar4[lVar8].rc.decimation_factor = 0;
          pLVar4[lVar8].rc.decimation_count = 0;
          iVar7 = av1_quantizer_to_qindex(pLVar4[lVar8].max_q);
          pLVar4[lVar8].rc.worst_quality = iVar7;
          iVar7 = av1_quantizer_to_qindex(pLVar4[lVar8].min_q);
          pLVar4[lVar8].rc.best_quality = iVar7;
          pLVar4[lVar8].rc.rtc_external_ratectrl = 0;
          pdVar1 = pLVar4[lVar8].p_rc.rate_correction_factors;
          *pdVar1 = 1.0;
          pdVar1[1] = 1.0;
          pdVar1 = pLVar4[lVar8].p_rc.rate_correction_factors + 2;
          *pdVar1 = 1.0;
          pdVar1[1] = 1.0;
          lVar5 = pLVar4[lVar8].layer_target_bitrate;
          pLVar4[lVar8].target_bandwidth = lVar5;
          iVar7 = pLVar4[lVar8].rc.worst_quality;
          pLVar4[lVar8].p_rc.last_q[1] = iVar7;
          pLVar4[lVar8].p_rc.avg_frame_qindex[1] = iVar7;
          pLVar4[lVar8].p_rc.avg_frame_qindex[0] = iVar7;
          lVar5 = (lVar5 * (cpi->oxcf).rc_cfg.starting_buffer_level_ms) / 1000;
          pLVar4[lVar8].p_rc.buffer_level = lVar5;
          pLVar4[lVar8].p_rc.bits_off_target = lVar5;
          if (((int)lVar11 == 0) && (1 < (cpi->svc).number_spatial_layers)) {
            pLVar4[lVar8].sb_index = 0;
            pLVar4[lVar8].actual_num_seg1_blocks = 0;
            pLVar4[lVar8].actual_num_seg2_blocks = 0;
            pLVar4[lVar8].counter_encode_maxq_scene_change = 0;
            aom_free(pLVar4[lVar8].map);
            piVar9 = (int8_t *)aom_calloc((long)iVar3 * (long)iVar2,1);
            pLVar4[lVar8].map = piVar9;
            if (piVar9 == (int8_t *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate lc->map");
            }
          }
          iVar6 = (cpi->svc).number_temporal_layers;
          lVar11 = lVar11 + 1;
        } while ((int)lVar11 < iVar6);
        iVar7 = (cpi->svc).number_spatial_layers;
      }
      (cpi->svc).downsample_filter_type[lVar10] = BILINEAR;
      (cpi->svc).downsample_filter_phase[lVar10] = 8;
      (cpi->svc).last_layer_dropped[lVar10] = false;
      (cpi->svc).drop_spatial_layer[lVar10] = false;
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar7);
    if (iVar7 == 3) {
      (cpi->svc).downsample_filter_type[0] = EIGHTTAP_SMOOTH;
    }
  }
  return;
}

Assistant:

void av1_init_layer_context(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  SVC *const svc = &cpi->svc;
  int mi_rows = cpi->common.mi_params.mi_rows;
  int mi_cols = cpi->common.mi_params.mi_cols;
  svc->base_framerate = 30.0;
  svc->current_superframe = 0;
  svc->force_zero_mode_spatial_ref = 1;
  svc->num_encoded_top_layer = 0;
  svc->use_flexible_mode = 0;
  svc->has_lower_quality_layer = 0;

  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      RATE_CONTROL *const lrc = &lc->rc;
      PRIMARY_RATE_CONTROL *const lp_rc = &lc->p_rc;
      lrc->ni_av_qi = oxcf->rc_cfg.worst_allowed_q;
      lp_rc->total_actual_bits = 0;
      lrc->ni_tot_qi = 0;
      lp_rc->tot_q = 0.0;
      lp_rc->avg_q = 0.0;
      lp_rc->ni_frames = 0;
      lrc->decimation_count = 0;
      lrc->decimation_factor = 0;
      lrc->worst_quality = av1_quantizer_to_qindex(lc->max_q);
      lrc->best_quality = av1_quantizer_to_qindex(lc->min_q);
      lrc->rtc_external_ratectrl = 0;
      for (int i = 0; i < RATE_FACTOR_LEVELS; ++i) {
        lp_rc->rate_correction_factors[i] = 1.0;
      }
      lc->target_bandwidth = lc->layer_target_bitrate;
      lp_rc->last_q[INTER_FRAME] = lrc->worst_quality;
      lp_rc->avg_frame_qindex[INTER_FRAME] = lrc->worst_quality;
      lp_rc->avg_frame_qindex[KEY_FRAME] = lrc->worst_quality;
      lp_rc->buffer_level =
          oxcf->rc_cfg.starting_buffer_level_ms * lc->target_bandwidth / 1000;
      lp_rc->bits_off_target = lp_rc->buffer_level;
      // Initialize the cyclic refresh parameters. If spatial layers are used
      // (i.e., ss_number_layers > 1), these need to be updated per spatial
      // layer. Cyclic refresh is only applied on base temporal layer.
      if (svc->number_spatial_layers > 1 && tl == 0) {
        lc->sb_index = 0;
        lc->actual_num_seg1_blocks = 0;
        lc->actual_num_seg2_blocks = 0;
        lc->counter_encode_maxq_scene_change = 0;
        aom_free(lc->map);
        CHECK_MEM_ERROR(cm, lc->map,
                        aom_calloc(mi_rows * mi_cols, sizeof(*lc->map)));
      }
    }
    svc->downsample_filter_type[sl] = BILINEAR;
    svc->downsample_filter_phase[sl] = 8;
    svc->last_layer_dropped[sl] = false;
    svc->drop_spatial_layer[sl] = false;
  }
  if (svc->number_spatial_layers == 3) {
    svc->downsample_filter_type[0] = EIGHTTAP_SMOOTH;
  }
}